

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::ShaderBuiltinConstantCase::iterate(ShaderBuiltinConstantCase *this)

{
  string *__rhs;
  ostringstream *this_00;
  ShaderType shaderType;
  RenderContext *renderCtx;
  GetConstantValueFunc p_Var1;
  TestLog *pTVar2;
  int iVar3;
  int iVar4;
  ShaderExecutor *pSVar5;
  undefined4 extraout_var;
  TestError *this_01;
  string *unit;
  void *__buf;
  char *description;
  bool bVar6;
  allocator<char> local_379;
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  shaderExecutor;
  int result;
  void *outputs;
  undefined1 local_328 [8];
  pointer local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_318;
  undefined1 auStack_308 [32];
  _Alloc_hider local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0 [8];
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [17];
  undefined1 local_1a8 [384];
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  shaderType = this->m_shaderType;
  auStack_308._24_8_ = &local_2e0;
  auStack_308._8_8_ = (pointer)0x0;
  auStack_308._16_8_ = (pointer)0x0;
  aStack_318._8_8_ = (pointer)0x0;
  auStack_308._0_8_ = (pointer)0x0;
  local_320 = (pointer)0x0;
  aStack_318._M_allocated_capacity = 0;
  local_2e8._M_p = (pointer)0x0;
  local_2e0._M_local_buf[0] = '\0';
  local_2d0 = (string  [8])local_2c0;
  local_2c8 = 0;
  local_2c0[0]._M_local_buf[0] = '\0';
  local_328._0_4_ = 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&result,"result = ",&local_379);
  __rhs = &this->m_varName;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,__rhs)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputs,";\n"
                );
  std::__cxx11::string::operator=(local_2d0,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&outputs);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string<std::allocator<char>>((string *)&outputs,"result",&local_379);
  glu::VarType::VarType((VarType *)&result,TYPE_INT,PRECISION_HIGHP);
  deqp::gls::ShaderExecUtil::Symbol::Symbol
            ((Symbol *)local_1a8,(string *)&outputs,(VarType *)&result);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            ((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              *)auStack_308,(Symbol *)local_1a8);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol((Symbol *)local_1a8);
  glu::VarType::~VarType((VarType *)&result);
  std::__cxx11::string::~string((string *)&outputs);
  pSVar5 = deqp::gls::ShaderExecUtil::createExecutor(renderCtx,shaderType,(ShaderSpec *)local_328);
  deqp::gls::ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)local_328);
  p_Var1 = this->m_getValue;
  shaderExecutor.
  super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  .m_data.ptr = pSVar5;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar3 = (*p_Var1)((Functions *)CONCAT44(extraout_var,iVar3));
  result = -1;
  outputs = (VarType *)&result;
  iVar4 = (*(shaderExecutor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.ptr)->_vptr_ShaderExecutor[2])();
  if ((char)iVar4 != '\0') {
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[5])();
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[6])
              (shaderExecutor.
               super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               .m_data.ptr,1,0,&outputs);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,glcts::fixed_sample_locations_values + 1,&local_379);
    unit = (string *)local_1a8;
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_328,__rhs,__rhs,unit,QP_KEY_TAG_NONE,(long)result);
    tcu::LogNumber<long>::write((LogNumber<long> *)local_328,(int)pTVar2,__buf,(size_t)unit);
    tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)local_328);
    std::__cxx11::string::~string((string *)local_1a8);
    bVar6 = result != iVar3;
    if (bVar6) {
      local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"ERROR: Expected ");
      std::operator<<((ostream *)this_00,(string *)__rhs);
      std::operator<<((ostream *)this_00," = ");
      std::ostream::operator<<(this_00,iVar3);
      local_328 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1a8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
      std::operator<<((ostream *)&local_320,"Test shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      (*(shaderExecutor.
         super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
         .m_data.ptr)->_vptr_ShaderExecutor[3])
                (shaderExecutor.
                 super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 .m_data.ptr,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
                );
      description = "Invalid builtin constant value";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar6,
               description);
    de::details::
    UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    ::~UniqueBase(&shaderExecutor.
                   super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 );
    return STOP;
  }
  (*(shaderExecutor.
     super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
     .m_data.ptr)->_vptr_ShaderExecutor[3])
            (shaderExecutor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.ptr,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
             ,0x8b);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderBuiltinConstantCase::IterateResult ShaderBuiltinConstantCase::iterate (void)
{
	using namespace gls::ShaderExecUtil;

	const de::UniquePtr<ShaderExecutor>	shaderExecutor	(createGetConstantExecutor(m_context.getRenderContext(), m_shaderType, m_varName));
	const int							reference		= m_getValue(m_context.getRenderContext().getFunctions());
	int									result			= -1;
	void* const							outputs			= &result;

	if (!shaderExecutor->isOk())
	{
		shaderExecutor->log(m_testCtx.getLog());
		TCU_FAIL("Compile failed");
	}

	shaderExecutor->useProgram();
	shaderExecutor->execute(1, DE_NULL, &outputs);

	m_testCtx.getLog() << TestLog::Integer(m_varName, m_varName, "", QP_KEY_TAG_NONE, result);

	if (result != reference)
	{
		m_testCtx.getLog() << TestLog::Message << "ERROR: Expected " << m_varName << " = " << reference << TestLog::EndMessage
						   << TestLog::Message << "Test shader:" << TestLog::EndMessage;
		shaderExecutor->log(m_testCtx.getLog());
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid builtin constant value");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}